

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

pattern * idItem(void)

{
  char cVar1;
  char *__s1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint val;
  ushort **ppuVar6;
  pattern *ppVar7;
  byte bVar8;
  ulong uVar9;
  char *s;
  byte *pbVar10;
  char msg [200];
  char acStack_f8 [208];
  
  __s1 = SymTable[tokenval].lexptr;
  iVar4 = strncmp(__s1,"FILE",4);
  if ((iVar4 == 0) &&
     (ppuVar6 = __ctype_b_loc(), (*(byte *)((long)*ppuVar6 + (long)__s1[4] * 2 + 1) & 8) != 0)) {
    val = parseInteger(__s1,4,10);
    iVar4 = 0x130;
    goto LAB_00124a2b;
  }
  iVar4 = strncmp(__s1,"CHAIN",5);
  if (iVar4 == 0) {
    ppuVar6 = __ctype_b_loc();
    uVar9 = (ulong)__s1[5];
    if ((uVar9 == 0x5f) || (((*ppuVar6)[uVar9] & 8) != 0)) {
      s = __s1 + 5;
      pbVar10 = (byte *)(__s1 + 6);
      do {
        if ((char)uVar9 == '_') {
          pbVar10[-1] = 0x20;
        }
        else if ((uVar9 & 0xff) == 0) goto LAB_0012492d;
        uVar9 = (ulong)*pbVar10;
        pbVar10 = pbVar10 + 1;
      } while( true );
    }
  }
  cVar1 = *__s1;
  if (((cVar1 == 'A') && (__s1[1] == 'L')) && (__s1[2] == 'T')) {
    ppuVar6 = __ctype_b_loc();
    bVar8 = __s1[3];
    if (((long)(char)bVar8 == 0x5f) || (((*ppuVar6)[(char)bVar8] & 8) != 0)) {
      if (bVar8 == 0x5f) {
        __s1[3] = ' ';
        bVar8 = 0x20;
      }
      val = (uint)bVar8;
      iVar4 = 0x133;
      goto LAB_00124a2b;
    }
  }
  iVar4 = strncmp(__s1,"MODEL",5);
  if ((iVar4 == 0) &&
     (ppuVar6 = __ctype_b_loc(), (*(byte *)((long)*ppuVar6 + (long)__s1[5] * 2 + 1) & 8) != 0)) {
    val = parseInteger(__s1,5,10);
    iVar4 = 0x131;
    goto LAB_00124a2b;
  }
  iVar4 = strncmp(__s1,"ATOM",4);
  if (iVar4 == 0) {
    ppuVar6 = __ctype_b_loc();
    uVar9 = (ulong)__s1[4];
    if ((uVar9 == 0x5f) || (((*ppuVar6)[uVar9] & 8) != 0)) {
      s = __s1 + 4;
      pbVar10 = (byte *)(__s1 + 5);
      do {
        if ((char)uVar9 == '_') {
          pbVar10[-1] = 0x20;
        }
        else if ((uVar9 & 0xff) == 0) goto LAB_00124991;
        uVar9 = (ulong)*pbVar10;
        pbVar10 = pbVar10 + 1;
      } while( true );
    }
  }
  if (((cVar1 == 'S') && (__s1[1] == 'E')) && (__s1[2] == 'G')) {
    ppuVar6 = __ctype_b_loc();
    uVar9 = (ulong)__s1[3];
    if ((uVar9 == 0x5f) || (((*ppuVar6)[uVar9] & 8) != 0)) {
      s = __s1 + 3;
      pbVar10 = (byte *)(__s1 + 4);
      do {
        if ((char)uVar9 == '_') {
          pbVar10[-1] = 0x20;
        }
        else if ((uVar9 & 0xff) == 0) goto LAB_00124a0b;
        uVar9 = (ulong)*pbVar10;
        pbVar10 = pbVar10 + 1;
      } while( true );
    }
  }
  iVar4 = strcmp(__s1,"ALL");
  val = 0;
  if (iVar4 == 0) {
    iVar4 = 0x136;
    goto LAB_00124a2b;
  }
  iVar5 = strcmp(__s1,"NONE");
  iVar4 = 0x137;
  if (iVar5 == 0) goto LAB_00124a2b;
  iVar5 = strcmp(__s1,"ALPHA");
  if (iVar5 == 0) {
    val = 4;
  }
  else {
    iVar5 = strcmp(__s1,"BETA");
    if (iVar5 == 0) {
      val = 8;
    }
    else {
      iVar5 = strcmp(__s1,"MAINCHAIN");
      val = 1;
      if ((iVar5 != 0) &&
         ((((cVar1 != 'M' || (__s1[1] != 'C')) || (__s1[2] != '\0')) &&
          (iVar5 = strcmp(__s1,"BACKBONE"), iVar5 != 0)))) {
        iVar5 = strcmp(__s1,"SIDECHAIN");
        val = 2;
        if ((iVar5 != 0) &&
           ((((cVar1 != 'S' || (__s1[1] != 'C')) || (__s1[2] != '\0')) &&
            (iVar5 = strcmp(__s1,"BASE"), iVar5 != 0)))) {
          iVar5 = strcmp(__s1,"NITROGEN");
          if (iVar5 == 0) {
            val = 0x10;
          }
          else {
            iVar5 = strcmp(__s1,"CARBON");
            if (iVar5 == 0) {
              val = 0x20;
            }
            else {
              iVar5 = strcmp(__s1,"OXYGEN");
              if (iVar5 == 0) {
                val = 0x40;
              }
              else {
                iVar5 = strcmp(__s1,"SULFUR");
                if (iVar5 == 0) {
                  val = 0x80;
                }
                else {
                  iVar5 = strcmp(__s1,"PHOSPHORUS");
                  if (iVar5 == 0) {
                    val = 0x100;
                  }
                  else {
                    iVar5 = strcmp(__s1,"HYDROGEN");
                    if (iVar5 == 0) {
                      val = 0x200;
                    }
                    else {
                      iVar5 = strcmp(__s1,"H2O");
                      val = 0x400;
                      if ((iVar5 != 0) && (iVar5 = strcmp(__s1,"WATER"), iVar5 != 0)) {
                        iVar5 = strcmp(__s1,"HET");
                        val = 0x800;
                        if ((iVar5 != 0) && (iVar5 = strcmp(__s1,"HETATM"), iVar5 != 0)) {
                          iVar5 = strcmp(__s1,"PROTEIN");
                          val = 0x1000;
                          if ((iVar5 != 0) && (iVar5 = strcmp(__s1,"PEPTIDE"), iVar5 != 0)) {
                            iVar5 = strcmp(__s1,"DNA");
                            val = 0x2000;
                            if ((iVar5 != 0) && (iVar5 = strcmp(__s1,"RNA"), iVar5 != 0)) {
                              iVar5 = strcmp(__s1,"METAL");
                              if (iVar5 == 0) {
                                val = 0x4000;
                              }
                              else {
                                iVar5 = strcmp(__s1,"METHYLENE");
                                if (iVar5 == 0) {
                                  val = 0x40000000;
                                }
                                else {
                                  iVar5 = strcmp(__s1,"METHYL");
                                  if (iVar5 == 0) {
                                    val = 0x8000;
                                  }
                                  else {
                                    iVar5 = strcmp(__s1,"DONOR");
                                    if (iVar5 == 0) {
                                      val = 0x10000;
                                    }
                                    else {
                                      iVar5 = strcmp(__s1,"ACCEPTOR");
                                      if (iVar5 == 0) {
                                        val = 0x20000;
                                      }
                                      else {
                                        iVar5 = strcmp(__s1,"NONPOLAR");
                                        val = 0x800000;
                                        if ((((iVar5 != 0) &&
                                             (iVar5 = strcmp(__s1,"HYDROPHOBIC"), iVar5 != 0)) &&
                                            (iVar5 = strcmp(__s1,"HPHOBIC"), iVar5 != 0)) &&
                                           (iVar5 = strcmp(__s1,"PHOBIC"), iVar5 != 0)) {
                                          iVar5 = strcmp(__s1,"POLAR");
                                          val = 0x1000000;
                                          if (((iVar5 != 0) &&
                                              (iVar5 = strcmp(__s1,"HYDROPHILIC"), iVar5 != 0)) &&
                                             ((iVar5 = strcmp(__s1,"HPHILIC"), iVar5 != 0 &&
                                              (iVar5 = strcmp(__s1,"PHILIC"), iVar5 != 0)))) {
                                            iVar5 = strcmp(__s1,"CHARGED");
                                            val = 0x2000000;
                                            if ((iVar5 != 0) &&
                                               (iVar5 = strcmp(__s1,"CHARGE"), iVar5 != 0)) {
                                              iVar5 = strcmp(__s1,"AROMATIC");
                                              if (iVar5 != 0) {
                                                iVar5 = strcmp(__s1,"GLY");
                                                if ((iVar5 == 0) ||
                                                   ((cVar1 == 'G' && (__s1[1] == '\0')))) {
                                                  val = lookup("GLY");
                                                  iVar4 = 0x135;
                                                  if (val != 0) goto LAB_00124a2b;
                                                  s = "GLY";
                                                  iVar5 = 0x135;
                                                  goto LAB_00124a1f;
                                                }
                                                iVar5 = strcmp(__s1,"ALA");
                                                if (iVar5 == 0) {
LAB_00124aee:
                                                  val = lookup("ALA");
                                                  iVar4 = 0x135;
                                                  if (val != 0) goto LAB_00124a2b;
                                                  s = "ALA";
                                                  iVar5 = 0x135;
                                                }
                                                else {
                                                  if (cVar1 == 'A') {
                                                    if (__s1[1] == '\0') goto LAB_00124aee;
                                                    iVar5 = strcmp(__s1,"VAL");
                                                    if (iVar5 != 0) {
LAB_00124b33:
                                                      iVar5 = strcmp(__s1,"PHE");
                                                      if (iVar5 == 0) goto LAB_00124c33;
LAB_00124bb0:
                                                      iVar5 = strcmp(__s1,"PRO");
                                                      if ((iVar5 == 0) ||
                                                         ((cVar1 == 'P' && (__s1[1] == '\0')))) {
LAB_00124c58:
                                                        val = lookup("PRO");
                                                        iVar4 = 0x135;
                                                        if (val != 0) goto LAB_00124a2b;
                                                        s = "PRO";
                                                        iVar5 = 0x135;
                                                        goto LAB_00124a1f;
                                                      }
LAB_00124bd8:
                                                      iVar5 = strcmp(__s1,"MET");
                                                      if (iVar5 != 0) {
                                                        if (cVar1 != 'M') {
                                                          iVar5 = strcmp(__s1,"ILE");
                                                          if (iVar5 == 0) {
LAB_00124cde:
                                                            val = lookup("ILE");
                                                            iVar4 = 0x135;
                                                            if (val != 0) goto LAB_00124a2b;
                                                            s = "ILE";
                                                            iVar5 = 0x135;
                                                          }
                                                          else {
                                                            if (cVar1 == 'I') {
                                                              if (__s1[1] == '\0')
                                                              goto LAB_00124cde;
                                                              iVar5 = strcmp(__s1,"LEU");
                                                              bVar2 = true;
                                                              if (iVar5 != 0) goto LAB_00124d7b;
                                                            }
                                                            else {
                                                              iVar5 = strcmp(__s1,"LEU");
                                                              if (iVar5 != 0) {
                                                                if (cVar1 != 'L') goto LAB_00124d79;
                                                                if (__s1[1] != '\0') {
                                                                  iVar5 = strcmp(__s1,"ASP");
                                                                  if (iVar5 != 0) {
                                                                    iVar5 = strcmp(__s1,"GLU");
                                                                    if (iVar5 != 0) {
                                                                      bVar2 = false;
                                                                      goto LAB_00124e0d;
                                                                    }
                                                                    goto LAB_00124e46;
                                                                  }
                                                                  goto LAB_00124db3;
                                                                }
                                                              }
                                                            }
LAB_00124d54:
                                                            val = lookup("LEU");
                                                            iVar4 = 0x135;
                                                            if (val != 0) goto LAB_00124a2b;
                                                            s = "LEU";
                                                            iVar5 = 0x135;
                                                          }
                                                          goto LAB_00124a1f;
                                                        }
                                                        if (__s1[1] != '\0') {
                                                          iVar5 = strcmp(__s1,"ILE");
                                                          if (iVar5 == 0) goto LAB_00124cde;
                                                          iVar5 = strcmp(__s1,"LEU");
                                                          if (iVar5 == 0) goto LAB_00124d54;
LAB_00124d79:
                                                          bVar2 = false;
LAB_00124d7b:
                                                          iVar5 = strcmp(__s1,"ASP");
                                                          if (iVar5 == 0) {
LAB_00124db3:
                                                            val = lookup("ASP");
                                                            iVar4 = 0x135;
                                                            if (val != 0) goto LAB_00124a2b;
                                                            s = "ASP";
                                                            iVar5 = 0x135;
                                                          }
                                                          else {
                                                            if (cVar1 == 'D') {
                                                              if (__s1[1] == '\0')
                                                              goto LAB_00124db3;
                                                              iVar5 = strcmp(__s1,"GLU");
                                                              if (iVar5 != 0) {
LAB_00124e0d:
                                                                iVar5 = strcmp(__s1,"LYS");
                                                                if (iVar5 != 0) {
                                                                  if (cVar1 != 'K') {
                                                                    iVar5 = strcmp(__s1,"ARG");
                                                                    if (iVar5 != 0) {
                                                                      if (cVar1 != 'R')
                                                                      goto LAB_00124ed8;
                                                                      bVar3 = true;
                                                                      if (__s1[1] != '\0')
                                                                      goto LAB_00124edb;
                                                                    }
LAB_00124eb3:
                                                                    val = lookup("ARG");
                                                                    iVar4 = 0x135;
                                                                    if (val != 0) goto LAB_00124a2b;
                                                                    s = "ARG";
                                                                    iVar5 = 0x135;
                                                                    goto LAB_00124a1f;
                                                                  }
                                                                  if (__s1[1] != '\0')
                                                                  goto LAB_00124e2d;
                                                                }
LAB_00124e6b:
                                                                val = lookup("LYS");
                                                                iVar4 = 0x135;
                                                                if (val != 0) goto LAB_00124a2b;
                                                                s = "LYS";
                                                                iVar5 = 0x135;
                                                                goto LAB_00124a1f;
                                                              }
                                                            }
                                                            else {
                                                              iVar5 = strcmp(__s1,"GLU");
                                                              if (iVar5 != 0) {
                                                                if (cVar1 != 'E') goto LAB_00124e0d;
                                                                if (__s1[1] != '\0') {
                                                                  iVar5 = strcmp(__s1,"LYS");
                                                                  if (iVar5 == 0) goto LAB_00124e6b;
LAB_00124e2d:
                                                                  iVar5 = strcmp(__s1,"ARG");
                                                                  if (iVar5 == 0) goto LAB_00124eb3;
LAB_00124ed8:
                                                                  bVar3 = false;
LAB_00124edb:
                                                                  iVar5 = strcmp(__s1,"SER");
                                                                  if (iVar5 == 0) {
LAB_00124f10:
                                                                    val = lookup("SER");
                                                                    iVar4 = 0x135;
                                                                    if (val != 0) goto LAB_00124a2b;
                                                                    s = "SER";
                                                                    iVar5 = 0x135;
                                                                  }
                                                                  else {
                                                                    if (cVar1 == 'S') {
                                                                      if (__s1[1] == '\0')
                                                                      goto LAB_00124f10;
                                                                      iVar5 = strcmp(__s1,"THR");
                                                                      if (iVar5 != 0) {
LAB_00124f55:
                                                                        iVar5 = strcmp(__s1,"TYR");
                                                                        if (iVar5 == 0)
                                                                        goto LAB_00125003;
LAB_00124fc7:
                                                                        iVar5 = strcmp(__s1,"HIS");
                                                                        if (iVar5 == 0) {
LAB_00125028:
                                                                          val = lookup("HIS");
                                                                          iVar4 = 0x135;
                                                                          if (val != 0)
                                                                          goto LAB_00124a2b;
                                                                          s = "HIS";
                                                                          iVar5 = 0x135;
                                                                        }
                                                                        else {
                                                                          if (cVar1 == 'H') {
                                                                            if (__s1[1] == '\0')
                                                                            goto LAB_00125028;
LAB_00124fe7:
                                                                            iVar5 = strcmp(__s1,
                                                  "CYS");
                                                  if (iVar5 != 0) {
LAB_00125082:
                                                    iVar5 = strcmp(__s1,"ASN");
                                                    if (iVar5 != 0) {
                                                      if (cVar1 != 'N') {
                                                        iVar5 = strcmp(__s1,"GLN");
                                                        if (iVar5 != 0) {
                                                          if (cVar1 != 'Q') goto LAB_00125148;
                                                          if (__s1[1] != '\0') {
                                                            iVar5 = strcmp(__s1,"TRP");
                                                            if (iVar5 == 0) goto LAB_0012530a;
                                                            goto LAB_00125170;
                                                          }
                                                        }
LAB_001252e5:
                                                        val = lookup("GLN");
                                                        iVar4 = 0x135;
                                                        if (val != 0) goto LAB_00124a2b;
                                                        s = "GLN";
                                                        iVar5 = 0x135;
                                                        goto LAB_00124a1f;
                                                      }
                                                      if (__s1[1] != '\0') goto LAB_001250a2;
                                                    }
LAB_001250e3:
                                                    val = lookup("ASN");
                                                    iVar4 = 0x135;
                                                    if (val != 0) goto LAB_00124a2b;
                                                    s = "ASN";
                                                    iVar5 = 0x135;
                                                    goto LAB_00124a1f;
                                                  }
                                                  }
                                                  else {
                                                    iVar5 = strcmp(__s1,"CYS");
                                                    if (iVar5 != 0) {
                                                      if (cVar1 != 'C') goto LAB_00125082;
                                                      if (__s1[1] != '\0') {
                                                        iVar5 = strcmp(__s1,"ASN");
                                                        if (iVar5 != 0) {
LAB_001250a2:
                                                          iVar5 = strcmp(__s1,"GLN");
                                                          if (iVar5 != 0) {
LAB_00125148:
                                                            iVar5 = strcmp(__s1,"TRP");
                                                            if ((iVar5 == 0) ||
                                                               ((cVar1 == 'W' && (__s1[1] == '\0')))
                                                               ) {
LAB_0012530a:
                                                              val = lookup("TRP");
                                                              iVar4 = 0x135;
                                                              if (val != 0) goto LAB_00124a2b;
                                                              s = "TRP";
                                                              iVar5 = 0x135;
                                                              goto LAB_00124a1f;
                                                            }
LAB_00125170:
                                                            iVar5 = strcmp(__s1,"ACE");
                                                            if (iVar5 == 0) {
                                                              val = lookup("ACE");
                                                              iVar4 = 0x135;
                                                              if (val != 0) goto LAB_00124a2b;
                                                              s = "ACE";
                                                              iVar5 = 0x135;
                                                            }
                                                            else {
                                                              iVar5 = strcmp(__s1,"ASX");
                                                              if (iVar5 == 0) {
                                                                val = lookup("ASX");
                                                                iVar4 = 0x135;
                                                                if (val != 0) goto LAB_00124a2b;
                                                                s = "ASX";
                                                                iVar5 = 0x135;
                                                              }
                                                              else {
                                                                iVar5 = strcmp(__s1,"GLX");
                                                                if (iVar5 == 0) {
                                                                  val = lookup("GLX");
                                                                  iVar4 = 0x135;
                                                                  if (val != 0) goto LAB_00124a2b;
                                                                  s = "GLX";
                                                                  iVar5 = 0x135;
                                                                }
                                                                else {
                                                                  iVar5 = strcmp(__s1,"MSE");
                                                                  if (iVar5 == 0) {
                                                                    val = lookup("MSE");
                                                                    iVar4 = 0x135;
                                                                    if (val != 0) goto LAB_00124a2b;
                                                                    s = "MSE";
                                                                    iVar5 = 0x135;
                                                                  }
                                                                  else {
                                                                    iVar5 = strcmp(__s1,"PCA");
                                                                    if (iVar5 == 0) {
                                                                      val = lookup("PCA");
                                                                      iVar4 = 0x135;
                                                                      if (val != 0)
                                                                      goto LAB_00124a2b;
                                                                      s = "PCA";
                                                                      iVar5 = 0x135;
                                                                    }
                                                                    else {
                                                                      iVar5 = strcmp(__s1,"NH2");
                                                                      if (iVar5 == 0) {
                                                                        val = lookup("NH2");
                                                                        iVar4 = 0x135;
                                                                        if (val != 0)
                                                                        goto LAB_00124a2b;
                                                                        s = "NH2";
                                                                        iVar5 = 0x135;
                                                                      }
                                                                      else {
                                                                        iVar5 = strcmp(__s1,"NME");
                                                                        if (iVar5 == 0) {
                                                                          val = lookup("NME");
                                                                          iVar4 = 0x135;
                                                                          if (val != 0)
                                                                          goto LAB_00124a2b;
                                                                          s = "NME";
                                                                          iVar5 = 0x135;
                                                                        }
                                                                        else {
                                                                          iVar5 = strcmp(__s1,"FOR")
                                                                          ;
                                                                          if (iVar5 != 0) {
                                                                            if (((bVar3) &&
                                                                                (__s1[1] == 'E')) &&
                                                                               (__s1[2] == 'S')) {
                                                                              ppuVar6 = 
                                                  __ctype_b_loc();
                                                  uVar9 = (ulong)__s1[3];
                                                  if ((uVar9 == 0x5f) ||
                                                     (((*ppuVar6)[uVar9] & 8) != 0)) {
                                                    s = __s1 + 3;
                                                    pbVar10 = (byte *)(__s1 + 4);
                                                    do {
                                                      if ((char)uVar9 == '_') {
                                                        pbVar10[-1] = 0x20;
                                                      }
                                                      else if ((uVar9 & 0xff) == 0)
                                                      goto LAB_0012554b;
                                                      uVar9 = (ulong)*pbVar10;
                                                      pbVar10 = pbVar10 + 1;
                                                    } while( true );
                                                  }
                                                  }
                                                  if (cVar1 == 'B') {
                                                    if (((__s1[1] == 'L') && (__s1[2] == 'T')) &&
                                                       (ppuVar6 = __ctype_b_loc(),
                                                       (*(byte *)((long)*ppuVar6 +
                                                                 (long)__s1[3] * 2 + 1) & 8) != 0))
                                                    {
                                                      val = parseInteger(__s1,3,10);
                                                      iVar4 = 0x13c;
                                                      goto LAB_00124a2b;
                                                    }
                                                    if (((__s1[1] == 'G') && (__s1[2] == 'T')) &&
                                                       (ppuVar6 = __ctype_b_loc(),
                                                       (*(byte *)((long)*ppuVar6 +
                                                                 (long)__s1[3] * 2 + 1) & 8) != 0))
                                                    {
                                                      val = parseInteger(__s1,3,10);
                                                      iVar4 = 0x13d;
                                                      goto LAB_00124a2b;
                                                    }
                                                  }
                                                  else if (cVar1 == 'O') {
                                                    if (((__s1[1] == 'L') && (__s1[2] == 'T')) &&
                                                       (ppuVar6 = __ctype_b_loc(),
                                                       (*(byte *)((long)*ppuVar6 +
                                                                 (long)__s1[3] * 2 + 1) & 8) != 0))
                                                    {
                                                      val = parseInteger(__s1,3,10);
                                                      iVar4 = 0x13a;
                                                      goto LAB_00124a2b;
                                                    }
                                                    if (((__s1[1] == 'G') && (__s1[2] == 'T')) &&
                                                       (ppuVar6 = __ctype_b_loc(),
                                                       (*(byte *)((long)*ppuVar6 +
                                                                 (long)__s1[3] * 2 + 1) & 8) != 0))
                                                    {
                                                      val = parseInteger(__s1,3,10);
                                                      iVar4 = 0x13b;
                                                      goto LAB_00124a2b;
                                                    }
                                                  }
                                                  if (((bVar2) && (__s1[1] == 'N')) &&
                                                     (__s1[2] == 'S')) {
                                                    ppuVar6 = __ctype_b_loc();
                                                    bVar8 = __s1[3];
                                                    if (((long)(char)bVar8 == 0x5f) ||
                                                       (((*ppuVar6)[(char)bVar8] & 8) != 0)) {
                                                      if (bVar8 == 0x5f) {
                                                        __s1[3] = ' ';
                                                        bVar8 = 0x20;
                                                      }
                                                      val = (uint)bVar8;
                                                      iVar4 = 0x140;
                                                      goto LAB_00124a2b;
                                                    }
                                                  }
                                                  val = 0;
                                                  sprintf(acStack_f8,
                                                          "syntax: unknown identifier: %s",__s1);
                                                  errmsg(acStack_f8);
                                                  ParseError = 1;
                                                  goto LAB_00124a2b;
                                                  }
                                                  val = lookup("FOR");
                                                  iVar4 = 0x135;
                                                  if (val != 0) goto LAB_00124a2b;
                                                  s = "FOR";
                                                  iVar5 = 0x135;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00124a1f;
                                                  }
                                                  goto LAB_001252e5;
                                                  }
                                                  goto LAB_001250e3;
                                                  }
                                                  }
                                                  }
                                                  val = lookup("CYS");
                                                  iVar4 = 0x135;
                                                  if (val != 0) goto LAB_00124a2b;
                                                  s = "CYS";
                                                  iVar5 = 0x135;
                                                  }
                                                  goto LAB_00124a1f;
                                                  }
                                                  }
                                                  else {
                                                    iVar5 = strcmp(__s1,"THR");
                                                    if (iVar5 != 0) {
                                                      if (cVar1 != 'T') {
                                                        iVar5 = strcmp(__s1,"TYR");
                                                        if (iVar5 != 0) {
                                                          if (cVar1 != 'Y') goto LAB_00124fc7;
                                                          if (__s1[1] != '\0') {
                                                            iVar5 = strcmp(__s1,"HIS");
                                                            if (iVar5 != 0) goto LAB_00124fe7;
                                                            goto LAB_00125028;
                                                          }
                                                        }
LAB_00125003:
                                                        val = lookup("TYR");
                                                        iVar4 = 0x135;
                                                        if (val != 0) goto LAB_00124a2b;
                                                        s = "TYR";
                                                        iVar5 = 0x135;
                                                        goto LAB_00124a1f;
                                                      }
                                                      if (__s1[1] != '\0') goto LAB_00124f55;
                                                    }
                                                  }
                                                  val = lookup("THR");
                                                  iVar4 = 0x135;
                                                  if (val != 0) goto LAB_00124a2b;
                                                  s = "THR";
                                                  iVar5 = 0x135;
                                                  }
                                                  goto LAB_00124a1f;
                                                  }
                                                  }
                                                  }
LAB_00124e46:
                                                  val = lookup("GLU");
                                                  iVar4 = 0x135;
                                                  if (val != 0) goto LAB_00124a2b;
                                                  s = "GLU";
                                                  iVar5 = 0x135;
                                                  }
                                                  goto LAB_00124a1f;
                                                  }
                                                  }
                                                  val = lookup("MET");
                                                  iVar4 = 0x135;
                                                  if (val != 0) goto LAB_00124a2b;
                                                  s = "MET";
                                                  iVar5 = 0x135;
                                                  goto LAB_00124a1f;
                                                  }
                                                  }
                                                  else {
                                                    iVar5 = strcmp(__s1,"VAL");
                                                    if (iVar5 != 0) {
                                                      if (cVar1 != 'V') {
                                                        iVar5 = strcmp(__s1,"PHE");
                                                        if (iVar5 != 0) {
                                                          if (cVar1 != 'F') goto LAB_00124bb0;
                                                          if (__s1[1] != '\0') {
                                                            iVar5 = strcmp(__s1,"PRO");
                                                            if (iVar5 == 0) goto LAB_00124c58;
                                                            goto LAB_00124bd8;
                                                          }
                                                        }
LAB_00124c33:
                                                        val = lookup("PHE");
                                                        iVar4 = 0x135;
                                                        if (val != 0) goto LAB_00124a2b;
                                                        s = "PHE";
                                                        iVar5 = 0x135;
                                                        goto LAB_00124a1f;
                                                      }
                                                      if (__s1[1] != '\0') goto LAB_00124b33;
                                                    }
                                                  }
                                                  val = lookup("VAL");
                                                  iVar4 = 0x135;
                                                  if (val != 0) goto LAB_00124a2b;
                                                  s = "VAL";
                                                  iVar5 = 0x135;
                                                }
                                                goto LAB_00124a1f;
                                              }
                                              val = 0x40000;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  iVar4 = 0x138;
  goto LAB_00124a2b;
LAB_0012492d:
  if (__s1[6] != '\0') {
    val = lookup(s);
    iVar4 = 0x132;
    goto LAB_00124a18;
  }
  __s1[4] = ' ';
  s = __s1 + 4;
  val = lookup(s);
  iVar4 = 0x132;
  iVar5 = 0x132;
  if (val != 0) goto LAB_00124a2b;
  goto LAB_00124a1f;
LAB_00124991:
  val = lookup(s);
  iVar4 = 0x139;
  goto LAB_00124a18;
LAB_00124a0b:
  val = lookup(s);
  iVar4 = 0x13f;
  goto LAB_00124a18;
LAB_0012554b:
  val = lookup(s);
  iVar4 = 0x135;
LAB_00124a18:
  iVar5 = iVar4;
  if (val == 0) {
LAB_00124a1f:
    iVar4 = iVar5;
    val = insert(s,0x193);
  }
LAB_00124a2b:
  ppVar7 = makeTerminal(iVar4,val);
  matchTok(0x193);
  return ppVar7;
}

Assistant:

pattern* idItem() {
   pattern *lhs = NULL;
   int type = 0, val = 0;
   char *s, *tmpstr;

   s = SymTable[tokenval].lexptr;

   if ((strncmp(s, "FILE", 4) == 0) && isdigit(s[4])) {
      type = FILE_NODE; val = parseInteger(s,4,10);
   }
   else if ((strncmp(s, "CHAIN", 5) == 0) && (isalnum(s[5])||(s[5]=='_'))) {
      type = CHAIN_NODE;
      for(tmpstr = s+5;  *tmpstr; tmpstr++) { /* substitute blank for _ */
         if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      if (s[6] == '\0') { 
         s[4] = ' ';
         val = lookup(s+4); if(val == 0) val = insert(s+4, ID_TOK);
      }
      else {
         val = lookup(s+5); if(val == 0) val = insert(s+5, ID_TOK);
      }
     /* type = CHAIN_NODE; val = (unsigned char)s[5]; */
   }
   else if ((strncmp(s, "ALT", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      if (s[3] == '_') {s[3] = ' ';}
      type = ALT_NODE; val = (unsigned char)s[3];
   }
   else if ((strncmp(s, "MODEL", 5) == 0) && isdigit(s[5])) {
      type = MODEL_NODE; val = parseInteger(s,5,10);
   }
   else if ((strncmp(s, "ATOM", 4) == 0) && (isalnum(s[4])||(s[4]=='_'))) {
      type = ANAME_NODE;
      for(tmpstr = s+4; *tmpstr; tmpstr++) { /* substitute blank for _ */
	 if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      val = lookup(s+4); if(val == 0) val = insert(s+4, ID_TOK);
   }
   else if ((strncmp(s, "SEG", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      type = SEGID_NODE;
      for(tmpstr = s+3; *tmpstr; tmpstr++) { /* substitute blank for _ */
	 if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      val = lookup(s+3); if(val == 0) val = insert(s+3, ID_TOK);
   }
   else if (strcmp(s, "ALL") == 0) {
      type = TRUE_NODE; val = 0;
   }
   else if (strcmp(s, "NONE") == 0) {
      type = FALSE_NODE; val = 0;
   }
   else if (strcmp(s, "ALPHA") == 0) {
      type = PROP_NODE; val = ALPHA_PROP;
   }
   else if (strcmp(s, "BETA") == 0) {
      type = PROP_NODE; val = BETA_PROP;
   }
   else if ((strcmp(s, "MAINCHAIN") == 0) || (strcmp(s, "MC") == 0)
        ||  (strcmp(s, "BACKBONE") == 0)) {
      type = PROP_NODE; val = MC_PROP;
   }
   else if ((strcmp(s, "SIDECHAIN") == 0) || (strcmp(s, "SC") == 0)
        ||  (strcmp(s, "BASE") == 0)) {
      type = PROP_NODE; val = SC_PROP;
   }
   else if (strcmp(s, "NITROGEN") == 0) {
      type = PROP_NODE; val = N_PROP;
   }
   else if (strcmp(s, "CARBON") == 0) {
      type = PROP_NODE; val = C_PROP;
   }
   else if (strcmp(s, "OXYGEN") == 0) {
      type = PROP_NODE; val = O_PROP;
   }
   else if (strcmp(s, "SULFUR") == 0) {
      type = PROP_NODE; val = S_PROP;
   }
   else if (strcmp(s, "PHOSPHORUS") == 0) {
      type = PROP_NODE; val = P_PROP;
   }
   else if (strcmp(s, "HYDROGEN") == 0) {
      type = PROP_NODE; val = H_PROP;
   }
   else if ((strcmp(s, "H2O") == 0) || (strcmp(s, "WATER") == 0)) {
      type = PROP_NODE; val = WATER_PROP;
   }
   else if ((strcmp(s, "HET") == 0) || (strcmp(s, "HETATM") == 0)) {
      type = PROP_NODE; val = HET_PROP;
   }
   else if ((strcmp(s, "PROTEIN") == 0) || (strcmp(s, "PEPTIDE") == 0)) {
      type = PROP_NODE; val = PROT_PROP;
   }
   else if ((strcmp(s, "DNA") == 0) || (strcmp(s, "RNA") == 0)) {
      type = PROP_NODE; val = DNA_PROP;
   }
   else if (strcmp(s, "METAL") == 0) {
      type = PROP_NODE; val = METAL_PROP;
   }
   else if (strcmp(s, "METHYLENE") == 0) {
      type = PROP_NODE; val = METHYLENE_PROP;
   }/*longer name first*/
      else if (strcmp(s, "METHYL") == 0) {
      type = PROP_NODE; val = METHYL_PROP;
   }
   else if (strcmp(s, "DONOR") == 0) {
      type = PROP_NODE; val = DONOR_PROP;
   }
   else if (strcmp(s, "ACCEPTOR") == 0) {
      type = PROP_NODE; val = ACCEPTOR_PROP;
   }
   else if ((strcmp(s, "NONPOLAR") == 0) || (strcmp(s, "HYDROPHOBIC") == 0)
        ||  (strcmp(s, "HPHOBIC")== 0)|| (strcmp(s, "PHOBIC") == 0)) {
      type = PROP_NODE; val = RHPHOBIC_PROP;
   }
   else if ((strcmp(s, "POLAR") == 0) || (strcmp(s, "HYDROPHILIC") == 0)
        ||  (strcmp(s, "HPHILIC")== 0)|| (strcmp(s, "PHILIC") == 0)) {
      type = PROP_NODE; val = RHPHILIC_PROP;
   }
   else if ((strcmp(s, "CHARGED") == 0) || (strcmp(s, "CHARGE") == 0)) {
      type = PROP_NODE; val = RCHARGED_PROP;
   }
   else if (strcmp(s, "AROMATIC") == 0) {
      type = PROP_NODE; val = AROMATIC_PROP;
   }
   else if ((strcmp(s, "GLY") == 0) || (strcmp(s, "G") == 0)) {
      type = RTYPE_NODE;
      val = lookup("GLY"); if(val == 0) val = insert("GLY", ID_TOK);
   }
   else if ((strcmp(s, "ALA") == 0) || (strcmp(s, "A") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ALA"); if(val == 0) val = insert("ALA", ID_TOK);
   }
   else if ((strcmp(s, "VAL") == 0) || (strcmp(s, "V") == 0)) {
      type = RTYPE_NODE;
      val = lookup("VAL"); if(val == 0) val = insert("VAL", ID_TOK);
   }
   else if ((strcmp(s, "PHE") == 0) || (strcmp(s, "F") == 0)) {
      type = RTYPE_NODE;
      val = lookup("PHE"); if(val == 0) val = insert("PHE", ID_TOK);
   }
   else if ((strcmp(s, "PRO") == 0) || (strcmp(s, "P") == 0)) {
      type = RTYPE_NODE;
      val = lookup("PRO"); if(val == 0) val = insert("PRO", ID_TOK);
   }
   else if ((strcmp(s, "MET") == 0) || (strcmp(s, "M") == 0)) {
      type = RTYPE_NODE;
      val = lookup("MET"); if(val == 0) val = insert("MET", ID_TOK);
   }
   else if ((strcmp(s, "ILE") == 0) || (strcmp(s, "I") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ILE"); if(val == 0) val = insert("ILE", ID_TOK);
   }
   else if ((strcmp(s, "LEU") == 0) || (strcmp(s, "L") == 0)) {
      type = RTYPE_NODE;
      val = lookup("LEU"); if(val == 0) val = insert("LEU", ID_TOK);
   }
   else if ((strcmp(s, "ASP") == 0) || (strcmp(s, "D") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ASP"); if(val == 0) val = insert("ASP", ID_TOK);
   }
   else if ((strcmp(s, "GLU") == 0) || (strcmp(s, "E") == 0)) {
      type = RTYPE_NODE;
      val = lookup("GLU"); if(val == 0) val = insert("GLU", ID_TOK);
   }
   else if ((strcmp(s, "LYS") == 0) || (strcmp(s, "K") == 0)) {
      type = RTYPE_NODE;
      val = lookup("LYS"); if(val == 0) val = insert("LYS", ID_TOK);
   }
   else if ((strcmp(s, "ARG") == 0) || (strcmp(s, "R") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ARG"); if(val == 0) val = insert("ARG", ID_TOK);
   }
   else if ((strcmp(s, "SER") == 0) || (strcmp(s, "S") == 0)) {
      type = RTYPE_NODE;
      val = lookup("SER"); if(val == 0) val = insert("SER", ID_TOK);
   }
   else if ((strcmp(s, "THR") == 0) || (strcmp(s, "T") == 0)) {
      type = RTYPE_NODE;
      val = lookup("THR"); if(val == 0) val = insert("THR", ID_TOK);
   }
   else if ((strcmp(s, "TYR") == 0) || (strcmp(s, "Y") == 0)) {
      type = RTYPE_NODE;
      val = lookup("TYR"); if(val == 0) val = insert("TYR", ID_TOK);
   }
   else if ((strcmp(s, "HIS") == 0) || (strcmp(s, "H") == 0)) {
      type = RTYPE_NODE;
      val = lookup("HIS"); if(val == 0) val = insert("HIS", ID_TOK);
   }
   else if ((strcmp(s, "CYS") == 0) || (strcmp(s, "C") == 0)) {
      type = RTYPE_NODE;
      val = lookup("CYS"); if(val == 0) val = insert("CYS", ID_TOK);
   }
   else if ((strcmp(s, "ASN") == 0) || (strcmp(s, "N") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ASN"); if(val == 0) val = insert("ASN", ID_TOK);
   }
   else if ((strcmp(s, "GLN") == 0) || (strcmp(s, "Q") == 0)) {
      type = RTYPE_NODE;
      val = lookup("GLN"); if(val == 0) val = insert("GLN", ID_TOK);
   }
   else if ((strcmp(s, "TRP") == 0) || (strcmp(s, "W") == 0)) {
      type = RTYPE_NODE;
      val = lookup("TRP"); if(val == 0) val = insert("TRP", ID_TOK);
   }
   else if (strcmp(s, "ACE") == 0) {
      type = RTYPE_NODE;
      val = lookup("ACE"); if(val == 0) val = insert("ACE", ID_TOK);
   }
   else if (strcmp(s, "ASX") == 0) {
      type = RTYPE_NODE;
      val = lookup("ASX"); if(val == 0) val = insert("ASX", ID_TOK);
   }
   else if (strcmp(s, "GLX") == 0) {
      type = RTYPE_NODE;
      val = lookup("GLX"); if(val == 0) val = insert("GLX", ID_TOK);
   }
   else if (strcmp(s, "MSE") == 0) {
      type = RTYPE_NODE;
      val = lookup("MSE"); if(val == 0) val = insert("MSE", ID_TOK);
   }
   else if (strcmp(s, "PCA") == 0) {
      type = RTYPE_NODE;
      val = lookup("PCA"); if(val == 0) val = insert("PCA", ID_TOK);
   }
   else if (strcmp(s, "NH2") == 0) {
      type = RTYPE_NODE;
      val = lookup("NH2"); if(val == 0) val = insert("NH2", ID_TOK);
   }
   else if (strcmp(s, "NME") == 0) {
      type = RTYPE_NODE;
      val = lookup("NME"); if(val == 0) val = insert("NME", ID_TOK);
   }
   else if (strcmp(s, "FOR") == 0) {
      type = RTYPE_NODE;
      val = lookup("FOR"); if(val == 0) val = insert("FOR", ID_TOK);
   }
   else if ((strncmp(s, "RES", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      type = RTYPE_NODE;
      for(tmpstr = s+3; *tmpstr; tmpstr++) { /* substitute blank for _ */
	 if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      val = lookup(s+3); if(val == 0) val = insert(s+3, ID_TOK);
   }
   else if ((strncmp(s, "OLT", 3) == 0) && isdigit(s[3])) {
      type = OCC_LT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "OGT", 3) == 0) && isdigit(s[3])) {
      type = OCC_GT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "BLT", 3) == 0) && isdigit(s[3])) {
      type = B_LT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "BGT", 3) == 0) && isdigit(s[3])) {
      type = B_GT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "INS", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      if (s[3] == '_') {s[3] = ' ';}
      type = INS_NODE; val = (unsigned char)s[3];
   }
   else {
        char msg[200];
	sprintf(msg,"syntax: unknown identifier: %s", s);
	errmsg(msg);
	ParseError = TRUE;
        type = FALSE_NODE;
        val = 0;
   }

   lhs = makeTerminal(type, val);
   matchTok(ID_TOK);
   return lhs;
}